

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void __thiscall RandStrLit::~RandStrLit(RandStrLit *this)

{
  (this->super_RandStrNode)._vptr_RandStrNode = (_func_int **)&PTR__RandStrLit_00359098;
  if (this->buf != (wchar_t *)0x0) {
    operator_delete__(this->buf);
  }
  RandStrNode::~RandStrNode(&this->super_RandStrNode);
  return;
}

Assistant:

~RandStrLit()
    {
        delete [] buf;
    }